

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fprintf_param_float_array(NetOptimize *this,int id,Mat *m,FILE *pp)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = m->w;
  pvVar2 = m->data;
  uVar3 = 0;
  fprintf((FILE *)pp," -%d=%d",(ulong)(id + 0x5b04),(ulong)uVar1);
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    fprintf((FILE *)pp,",%e",(double)*(float *)((long)pvVar2 + uVar3 * 4));
  }
  return 0;
}

Assistant:

int NetOptimize::fprintf_param_float_array(int id, const ncnn::Mat& m, FILE* pp)
{
    const int count = m.w;
    const float* ptr = m;

    fprintf(pp, " -%d=%d", 23300 + id, count);
    for (int i=0; i<count; i++)
    {
        fprintf(pp, ",%e", ptr[i]);
    }

    return 0;
}